

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_rasterizer_cells_aa.h
# Opt level: O2

void __thiscall
agg::rasterizer_cells_aa<agg::cell_aa>::rasterizer_cells_aa(rasterizer_cells_aa<agg::cell_aa> *this)

{
  (this->m_sorted_y).m_size = 0;
  (this->m_sorted_y).m_capacity = 0;
  (this->m_sorted_y).m_array = (sorted_y *)0x0;
  (this->m_sorted_cells).m_size = 0;
  (this->m_sorted_cells).m_capacity = 0;
  (this->m_sorted_cells).m_array = (cell_aa **)0x0;
  this->m_cells = (cell_type **)0x0;
  this->m_curr_cell_ptr = (cell_type *)0x0;
  this->m_num_blocks = 0;
  this->m_max_blocks = 0;
  this->m_curr_block = 0;
  this->m_num_cells = 0;
  this->m_min_x = 0x7fffffff;
  this->m_min_y = 0x7fffffff;
  this->m_max_x = -0x80000000;
  this->m_max_y = -0x80000000;
  this->m_sorted = false;
  (this->m_style_cell).x = 0x7fffffff;
  (this->m_style_cell).y = 0x7fffffff;
  (this->m_style_cell).cover = 0;
  (this->m_style_cell).area = 0;
  (this->m_curr_cell).x = 0x7fffffff;
  (this->m_curr_cell).y = 0x7fffffff;
  (this->m_curr_cell).cover = 0;
  (this->m_curr_cell).area = 0;
  return;
}

Assistant:

rasterizer_cells_aa<Cell>::rasterizer_cells_aa() :
        m_num_blocks(0),
        m_max_blocks(0),
        m_curr_block(0),
        m_num_cells(0),
        m_cells(0),
        m_curr_cell_ptr(0),
        m_sorted_cells(),
        m_sorted_y(),
        m_min_x(std::numeric_limits<int>::max()),
        m_min_y(std::numeric_limits<int>::max()),
        m_max_x(std::numeric_limits<int>::min()),
        m_max_y(std::numeric_limits<int>::min()),
        m_sorted(false)
    {
        m_style_cell.initial();
        m_curr_cell.initial();
    }